

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall
ctemplate::SectionTemplateNode::SectionTemplateNode
          (SectionTemplateNode *this,TemplateToken *token,bool hidden_by_default)

{
  size_t sVar1;
  char *pcVar2;
  undefined4 uVar3;
  TemplateId TVar4;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__SectionTemplateNode_0014d198;
  uVar3 = *(undefined4 *)&token->field_0x4;
  pcVar2 = token->text;
  (this->token_).type = token->type;
  *(undefined4 *)&(this->token_).field_0x4 = uVar3;
  (this->token_).text = pcVar2;
  (this->token_).textlen = token->textlen;
  std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::vector
            (&(this->token_).modvals,&token->modvals);
  sVar1 = (this->token_).textlen;
  (this->variable_).super_TemplateString.ptr_ = (this->token_).text;
  (this->variable_).super_TemplateString.length_ = sVar1;
  (this->variable_).super_TemplateString.is_immutable_ = false;
  (this->variable_).super_TemplateString.id_ = 0;
  TVar4 = TemplateString::GetGlobalId(&(this->variable_).super_TemplateString);
  (this->variable_).super_TemplateString.id_ = TVar4;
  (this->node_list_).
  super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->node_list_;
  (this->node_list_).
  super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->node_list_;
  (this->node_list_).
  super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>._M_impl.
  _M_node._M_size = 0;
  this->separator_section_ = (SectionTemplateNode *)0x0;
  (this->indentation_)._M_dataplus._M_p = (pointer)&(this->indentation_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->indentation_,"\n","");
  this->hidden_by_default_ = hidden_by_default;
  return;
}

Assistant:

SectionTemplateNode::SectionTemplateNode(const TemplateToken& token,
                                         bool hidden_by_default)

    : token_(token),
      variable_(token_.text, token_.textlen),
      separator_section_(NULL), indentation_("\n"),
      hidden_by_default_(hidden_by_default) {
  VLOG(2) << "Constructing SectionTemplateNode: "
          << string(token_.text, token_.textlen) << endl;
}